

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre.cc
# Opt level: O2

bool __thiscall re2::EmptyStringWalker::ShortVisit(EmptyStringWalker *this,Regexp *re,bool a)

{
  LogMessageFatal LStack_188;
  
  LogMessageFatal::LogMessageFatal
            (&LStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/mimics_pcre.cc",
             0x7a);
  std::operator<<((ostream *)&LStack_188.super_LogMessage.str_,
                  "EmptyStringWalker::ShortVisit called");
  LogMessageFatal::~LogMessageFatal(&LStack_188);
  return a;
}

Assistant:

bool ShortVisit(Regexp* re, bool a) {
    // Should never be called: we use Walk not WalkExponential.
    LOG(DFATAL) << "EmptyStringWalker::ShortVisit called";
    return a;
  }